

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseVersionInfo(xmlParserCtxtPtr ctxt)

{
  xmlChar *local_20;
  xmlChar *version;
  xmlParserCtxtPtr ctxt_local;
  
  local_20 = (xmlChar *)0x0;
  if ((((*ctxt->input->cur == 'v') && (ctxt->input->cur[1] == 'e')) && (ctxt->input->cur[2] == 'r'))
     && (((ctxt->input->cur[3] == 's' && (ctxt->input->cur[4] == 'i')) &&
         ((ctxt->input->cur[5] == 'o' && (ctxt->input->cur[6] == 'n')))))) {
    ctxt->input->cur = ctxt->input->cur + 7;
    ctxt->input->col = ctxt->input->col + 7;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    xmlSkipBlankChars(ctxt);
    if (*ctxt->input->cur != '=') {
      xmlFatalErr(ctxt,XML_ERR_EQUAL_REQUIRED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
    if (*ctxt->input->cur == '\"') {
      xmlNextChar(ctxt);
      local_20 = xmlParseVersionNum(ctxt);
      if (*ctxt->input->cur == '\"') {
        xmlNextChar(ctxt);
      }
      else {
        xmlFatalErr(ctxt,XML_ERR_STRING_NOT_CLOSED,(char *)0x0);
      }
    }
    else if (*ctxt->input->cur == '\'') {
      xmlNextChar(ctxt);
      local_20 = xmlParseVersionNum(ctxt);
      if (*ctxt->input->cur == '\'') {
        xmlNextChar(ctxt);
      }
      else {
        xmlFatalErr(ctxt,XML_ERR_STRING_NOT_CLOSED,(char *)0x0);
      }
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_STRING_NOT_STARTED,(char *)0x0);
    }
  }
  return local_20;
}

Assistant:

xmlChar *
xmlParseVersionInfo(xmlParserCtxtPtr ctxt) {
    xmlChar *version = NULL;

    if (CMP7(CUR_PTR, 'v', 'e', 'r', 's', 'i', 'o', 'n')) {
	SKIP(7);
	SKIP_BLANKS;
	if (RAW != '=') {
	    xmlFatalErr(ctxt, XML_ERR_EQUAL_REQUIRED, NULL);
	    return(NULL);
        }
	NEXT;
	SKIP_BLANKS;
	if (RAW == '"') {
	    NEXT;
	    version = xmlParseVersionNum(ctxt);
	    if (RAW != '"') {
		xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
	    } else
	        NEXT;
	} else if (RAW == '\''){
	    NEXT;
	    version = xmlParseVersionNum(ctxt);
	    if (RAW != '\'') {
		xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
	    } else
	        NEXT;
	} else {
	    xmlFatalErr(ctxt, XML_ERR_STRING_NOT_STARTED, NULL);
	}
    }
    return(version);
}